

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopicTree.h
# Opt level: O1

void __thiscall uWS::TopicTree::~TopicTree(TopicTree *this)

{
  Topic *pTVar1;
  _Manager_type p_Var2;
  
  pTVar1 = this->root;
  if (pTVar1 != (Topic *)0x0) {
    std::
    _Rb_tree<uWS::Subscriber_*,_uWS::Subscriber_*,_std::_Identity<uWS::Subscriber_*>,_std::less<uWS::Subscriber_*>,_std::allocator<uWS::Subscriber_*>_>
    ::~_Rb_tree(&(pTVar1->subs)._M_t);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~_Rb_tree(&(pTVar1->messages)._M_t);
    std::
    _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::Topic_*>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::Topic_*>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::Topic_*>_>_>
    ::~_Rb_tree(&(pTVar1->children)._M_t);
    operator_delete(pTVar1,0xc0);
  }
  p_Var2 = (this->cb).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)this,(_Any_data *)this,__destroy_functor);
  }
  return;
}

Assistant:

~TopicTree() {
        delete root;
    }